

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MPP_RET mpp_buffer_create(char *tag,char *caller,MppBufferGroupImpl *group,MppBufferInfo *info,
                         MppBufferImpl **buffer)

{
  int iVar1;
  undefined8 uVar2;
  MppBufferService *this;
  MppBufOps ops;
  MppBufferImpl *local_58;
  pthread_mutexattr_t local_4c;
  MppBufferImpl *pMStack_48;
  pthread_mutexattr_t attr;
  MppBufferImpl *p;
  BufferOp func;
  MppBufferImpl **ppMStack_30;
  MPP_RET ret;
  MppBufferImpl **buffer_local;
  MppBufferInfo *info_local;
  MppBufferGroupImpl *group_local;
  char *caller_local;
  char *tag_local;
  
  ppMStack_30 = buffer;
  buffer_local = (MppBufferImpl **)info;
  info_local = (MppBufferInfo *)group;
  group_local = (MppBufferGroupImpl *)caller;
  caller_local = tag;
  if ((mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_create");
  }
  func._4_4_ = 0;
  p = (MppBufferImpl *)0x0;
  pMStack_48 = (MppBufferImpl *)0x0;
  if (info_local == (MppBufferInfo *)0x0) {
    _mpp_log_l(2,"mpp_buffer","can not create buffer without group\n","mpp_buffer_create");
    func._4_4_ = MPP_NOK;
  }
  else if ((info_local[2].fd == 0) || (*(int *)((long)&info_local[3].ptr + 4) < info_local[2].fd)) {
    if ((info_local[2].hnd == (void *)0x0) ||
       (buffer_local[1] <= (MppBufferImpl *)info_local[2].hnd)) {
      pMStack_48 = (MppBufferImpl *)mpp_mem_pool_get_f(group_local->tag,mpp_buffer_pool);
      if (pMStack_48 == (MppBufferImpl *)0x0) {
        _mpp_log_l(2,"mpp_buffer","failed to allocate context\n","mpp_buffer_create");
        func._4_4_ = MPP_ERR_MALLOC;
      }
      else {
        if (info_local[1].fd == 0) {
          local_58 = *(MppBufferImpl **)(info_local[1].size + 8);
        }
        else {
          local_58 = *(MppBufferImpl **)(info_local[1].size + 0x18);
        }
        p = local_58;
        func._4_4_ = (*(code *)local_58)(*(undefined8 *)(info_local + 1),buffer_local);
        if (func._4_4_ == MPP_OK) {
          if (caller_local == (char *)0x0) {
            caller_local = (char *)info_local;
          }
          snprintf(pMStack_48->tag,0x20,"%s",caller_local);
          pMStack_48->caller = group_local->tag;
          pthread_mutexattr_init(&local_4c);
          pthread_mutexattr_settype(&local_4c,1);
          pthread_mutex_init((pthread_mutex_t *)&pMStack_48->lock,&local_4c);
          pthread_mutexattr_destroy(&local_4c);
          pMStack_48->allocator = *(MppAllocator *)(info_local + 1);
          pMStack_48->alloc_api = (MppAllocatorApi *)info_local[1].size;
          pMStack_48->log_runtime_en = *(RK_U32 *)((long)&info_local[1].ptr + 4);
          pMStack_48->log_history_en = *(RK_U32 *)&info_local[1].hnd;
          pMStack_48->group_id = *(RK_U32 *)((long)&info_local[1].hnd + 4);
          pMStack_48->mode = info_local[1].fd;
          pMStack_48->type = info_local[1].index;
          pMStack_48->uncached = (uint)(((ulong)info_local[1].ptr & 2) == 0);
          pMStack_48->logs = (MppBufLogs *)info_local[6].ptr;
          memcpy(&pMStack_48->info,buffer_local,0x28);
          pthread_mutex_lock((pthread_mutex_t *)(info_local + 4));
          iVar1 = *(int *)&info_local[3].ptr;
          *(int *)&info_local[3].ptr = iVar1 + 1;
          pMStack_48->buffer_id = iVar1;
          (pMStack_48->list_status).next = &pMStack_48->list_status;
          (pMStack_48->list_status).prev = &pMStack_48->list_status;
          (pMStack_48->list_maps).next = &pMStack_48->list_maps;
          (pMStack_48->list_maps).prev = &pMStack_48->list_maps;
          if (ppMStack_30 == (MppBufferImpl **)0x0) {
            list_add_tail(&pMStack_48->list_status,(list_head *)&info_local[5].fd);
            *(int *)((long)&info_local[6].size + 4) = *(int *)((long)&info_local[6].size + 4) + 1;
          }
          else {
            pMStack_48->ref_count = pMStack_48->ref_count + 1;
            pMStack_48->used = 1;
            list_add_tail(&pMStack_48->list_status,(list_head *)&info_local[5].ptr);
            *(int *)&info_local[6].size = (int)info_local[6].size + 1;
            *ppMStack_30 = pMStack_48;
          }
          info_local[3].size = (size_t)(buffer_local[1]->tag + info_local[3].size);
          *(int *)((long)&info_local[3].ptr + 4) = *(int *)((long)&info_local[3].ptr + 4) + 1;
          pthread_mutex_unlock((pthread_mutex_t *)(info_local + 4));
          ops = BUF_COMMIT;
          if (info_local[1].fd == 0) {
            ops = BUF_CREATE;
          }
          buf_add_log(pMStack_48,ops,group_local->tag);
          if (info_local[1].fd == 0) {
            this = MppBufferService::get_instance();
            MppBufferService::inc_total(this,(RK_U32)buffer_local[1]);
          }
          if (info_local[3].hnd != (void *)0x0) {
            uVar2._0_4_ = info_local[3].fd;
            uVar2._4_4_ = info_local[3].index;
            (*(code *)info_local[3].hnd)(uVar2,info_local);
          }
        }
        else {
          _mpp_log_l(2,"mpp_buffer","failed to create buffer with size %d\n","mpp_buffer_create",
                     buffer_local[1]);
          mpp_mem_pool_put_f(group_local->tag,mpp_buffer_pool,pMStack_48);
          func._4_4_ = MPP_ERR_MALLOC;
        }
      }
    }
    else {
      _mpp_log_l(2,"mpp_buffer","required size %d reach group size limit %d\n","mpp_buffer_create",
                 buffer_local[1],info_local[2].hnd);
      func._4_4_ = MPP_NOK;
    }
  }
  else {
    if (*(int *)((long)&info_local[1].ptr + 4) != 0) {
      _mpp_log_l(4,"mpp_buffer","group %d reach count limit %d\n","mpp_buffer_create",
                 (ulong)*(uint *)((long)&info_local[1].hnd + 4),(ulong)(uint)info_local[2].fd);
    }
    func._4_4_ = MPP_NOK;
  }
  if ((mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_create");
  }
  return func._4_4_;
}

Assistant:

MPP_RET mpp_buffer_create(const char *tag, const char *caller,
                          MppBufferGroupImpl *group, MppBufferInfo *info,
                          MppBufferImpl **buffer)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = MPP_OK;
    BufferOp func = NULL;
    MppBufferImpl *p = NULL;

    if (NULL == group) {
        mpp_err_f("can not create buffer without group\n");
        ret = MPP_NOK;
        goto RET;
    }

    if (group->limit_count && group->buffer_count >= group->limit_count) {
        if (group->log_runtime_en)
            mpp_log_f("group %d reach count limit %d\n", group->group_id, group->limit_count);
        ret = MPP_NOK;
        goto RET;
    }

    if (group->limit_size && info->size > group->limit_size) {
        mpp_err_f("required size %d reach group size limit %d\n", info->size, group->limit_size);
        ret = MPP_NOK;
        goto RET;
    }

    p = (MppBufferImpl *)mpp_mem_pool_get_f(caller, mpp_buffer_pool);
    if (NULL == p) {
        mpp_err_f("failed to allocate context\n");
        ret = MPP_ERR_MALLOC;
        goto RET;
    }

    func = (group->mode == MPP_BUFFER_INTERNAL) ?
           (group->alloc_api->alloc) : (group->alloc_api->import);
    ret = func(group->allocator, info);
    if (ret) {
        mpp_err_f("failed to create buffer with size %d\n", info->size);
        mpp_mem_pool_put_f(caller, mpp_buffer_pool, p);
        ret = MPP_ERR_MALLOC;
        goto RET;
    }

    if (NULL == tag)
        tag = group->tag;

    snprintf(p->tag, sizeof(p->tag), "%s", tag);
    p->caller = caller;
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&p->lock, &attr);
    pthread_mutexattr_destroy(&attr);
    p->allocator = group->allocator;
    p->alloc_api = group->alloc_api;
    p->log_runtime_en = group->log_runtime_en;
    p->log_history_en = group->log_history_en;
    p->group_id = group->group_id;
    p->mode = group->mode;
    p->type = group->type;
    p->uncached = (group->flags & MPP_ALLOC_FLAG_CACHABLE) ? 0 : 1;
    p->logs = group->logs;
    p->info = *info;

    pthread_mutex_lock(&group->buf_lock);
    p->buffer_id = group->buffer_id++;
    INIT_LIST_HEAD(&p->list_status);
    INIT_LIST_HEAD(&p->list_maps);

    if (buffer) {
        p->ref_count++;
        p->used = 1;
        list_add_tail(&p->list_status, &group->list_used);
        group->count_used++;
        *buffer = p;
    } else {
        list_add_tail(&p->list_status, &group->list_unused);
        group->count_unused++;
    }

    group->usage += info->size;
    group->buffer_count++;
    pthread_mutex_unlock(&group->buf_lock);

    buf_add_log(p, (group->mode == MPP_BUFFER_INTERNAL) ? (BUF_CREATE) : (BUF_COMMIT), caller);

    if (group->mode == MPP_BUFFER_INTERNAL)
        MppBufferService::get_instance()->inc_total(info->size);

    if (group->callback)
        group->callback(group->arg, group);
RET:
    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}